

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetSourceFilePropertyCommand::InitialPass
          (cmGetSourceFilePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  pointer pbVar1;
  bool bVar2;
  cmSourceFile *this_00;
  char *value;
  long lVar3;
  cmMakefile *pcVar4;
  allocator local_51;
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (lVar3 == 0x60) {
    this_00 = cmMakefile::GetSource((this->super_cmCommand).Makefile,name + 1);
    if ((this_00 != (cmSourceFile *)0x0) ||
       ((bVar2 = std::operator==((args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 2,"LOCATION"), bVar2
        && (this_00 = cmMakefile::CreateSource((this->super_cmCommand).Makefile,name + 1,false),
           this_00 != (cmSourceFile *)0x0)))) {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"LANGUAGE");
      if (bVar2) {
        pcVar4 = (this->super_cmCommand).Makefile;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_50,this_00);
        cmMakefile::AddDefinition(pcVar4,name,local_50._M_dataplus._M_p);
        goto LAB_0031458e;
      }
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pbVar1[2]._M_string_length == 0) ||
         (value = cmSourceFile::GetPropertyForUser(this_00,pbVar1 + 2), value == (char *)0x0))
      goto LAB_003145f1;
      pcVar4 = (this->super_cmCommand).Makefile;
    }
    else {
LAB_003145f1:
      pcVar4 = (this->super_cmCommand).Makefile;
      value = "NOTFOUND";
    }
    cmMakefile::AddDefinition(pcVar4,name,value);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_50,"called with incorrect number of arguments",&local_51);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
LAB_0031458e:
    std::__cxx11::string::~string((string *)&local_50);
  }
  return lVar3 == 0x60;
}

Assistant:

bool cmGetSourceFilePropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string const& var = args[0];
  std::string const& file = args[1];
  cmSourceFile* sf = this->Makefile->GetSource(file);

  // for the location we must create a source file first
  if (!sf && args[2] == "LOCATION") {
    sf = this->Makefile->CreateSource(file);
  }
  if (sf) {
    if (args[2] == "LANGUAGE") {
      this->Makefile->AddDefinition(var, sf->GetLanguage().c_str());
      return true;
    }
    const char* prop = CM_NULLPTR;
    if (!args[2].empty()) {
      prop = sf->GetPropertyForUser(args[2]);
    }
    if (prop) {
      this->Makefile->AddDefinition(var, prop);
      return true;
    }
  }

  this->Makefile->AddDefinition(var, "NOTFOUND");
  return true;
}